

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O3

void PDHG_Check_Data(CUPDLPwork *work)

{
  double dVar1;
  double dVar2;
  CUPDLPproblem *pCVar3;
  CUPDLPdata *pCVar4;
  cupdlp_int *pcVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint local_4c;
  uint local_48;
  uint local_44;
  
  pCVar3 = work->problem;
  pCVar4 = pCVar3->data;
  if (pCVar4->nCols < 1) {
    local_4c = 0;
    uVar8 = 0;
    uVar7 = 0;
    local_48 = 0;
    local_44 = 0;
  }
  else {
    uVar9 = 0;
    local_44 = 0;
    local_48 = 0;
    uVar7 = 0;
    uVar8 = 0;
    local_4c = 0;
    do {
      dVar1 = pCVar3->lower[uVar9];
      dVar2 = pCVar3->upper[uVar9];
      if (((dVar1 == -INFINITY) && (dVar2 == INFINITY)) &&
         (local_44 = local_44 + 1, 0 < work->settings->nLogLevel)) {
        printf("Warning: variable %d is free.",uVar9 & 0xffffffff);
      }
      if ((dVar1 != -INFINITY) && (dVar2 != INFINITY)) {
        if ((pCVar3->lower[uVar9] != pCVar3->upper[uVar9]) ||
           (NAN(pCVar3->lower[uVar9]) || NAN(pCVar3->upper[uVar9]))) {
          local_4c = local_4c + 1;
        }
        else {
          local_48 = local_48 + 1;
        }
      }
      uVar8 = uVar8 + (dVar1 != -INFINITY && dVar2 == INFINITY);
      uVar7 = uVar7 + (dVar1 == -INFINITY && dVar2 != INFINITY);
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < (long)pCVar4->nCols);
  }
  iVar6 = pCVar4->nRows;
  if (0 < iVar6) {
    uVar9 = 0;
    do {
      pcVar5 = pCVar3->data->csr_matrix->rowMatBeg;
      if ((pcVar5[uVar9 + 1] - pcVar5[uVar9] == 1) && (0 < work->settings->nLogLevel)) {
        printf("Warning: row %d is a singleton row.",uVar9 & 0xffffffff);
        iVar6 = pCVar4->nRows;
      }
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < (long)iVar6);
  }
  if (work->settings->nLogLevel < 1) {
    return;
  }
  printf("nFreeCol  : %d\n",(ulong)local_44);
  printf("nFixedCol : %d\n",(ulong)local_48);
  printf("nRangedCol: %d\n",(ulong)local_4c);
  printf("nLowerCol : %d\n",(ulong)uVar8);
  printf("nUpperCol : %d\n",(ulong)uVar7);
  printf("nFreeRow  : %d\n",0);
  printf("nFixedRow : %d\n",0);
  printf("nRangedRow: %d\n",0);
  printf("nLowerRow : %d\n",0);
  printf("nUpperRow : %d\n",0);
  return;
}

Assistant:

void PDHG_Check_Data(CUPDLPwork *work) {
  CUPDLPproblem *problem = work->problem;
  CUPDLPdata *lp = problem->data;
  CUPDLPstepsize *stepsize = work->stepsize;
  CUPDLPiterates *iterates = work->iterates;
  cupdlp_int nFreeCol = 0;
  cupdlp_int nFixedCol = 0;
  cupdlp_int nUpperCol = 0;
  cupdlp_int nLowerCol = 0;
  cupdlp_int nRangedCol = 0;
  cupdlp_int nFreeRow = 0;
  cupdlp_int nFixedRow = 0;
  cupdlp_int nUpperRow = 0;
  cupdlp_int nLowerRow = 0;
  cupdlp_int nRangedRow = 0;


  cupdlp_int iter = work->timers->nIter;
  CUPDLPvec *x = iterates->x[iter % 2];
  CUPDLPvec *y = iterates->y[iter % 2];

  for (cupdlp_int iSeq = 0; iSeq < lp->nCols; ++iSeq) {
    cupdlp_bool hasLower = problem->lower[iSeq] > -INFINITY;
    cupdlp_bool hasUpper = problem->upper[iSeq] < +INFINITY;

    if (!hasLower && !hasUpper) {
      ++nFreeCol;
      if (work->settings->nLogLevel>0) 
	cupdlp_printf("Warning: variable %d is free.", iSeq);
    }

    if (hasLower && hasUpper) {
      if (problem->lower[iSeq] == problem->upper[iSeq]) {
        ++nFixedCol;
        // cupdlp_printf( "Warning: variable %d is fixed.", iSeq);
      } else
        ++nRangedCol;
    }

    if (hasLower) {
      // XXX: uncommented for PDLP comparison
      // CUPDLP_ASSERT(x[iSeq] >= problem->lower[iSeq]);
      nLowerCol += !hasUpper;
    }

    if (hasUpper) {
      // XXX: uncommented for PDLP comparison
      // CUPDLP_ASSERT(x[iSeq] <= problem->upper[iSeq]);
      nUpperCol += !hasLower;
    }
  }

  for (cupdlp_int iSeq = lp->nCols; iSeq < lp->nCols; ++iSeq) {
    cupdlp_bool hasLower = problem->lower[iSeq] > -INFINITY;
    cupdlp_bool hasUpper = problem->upper[iSeq] < +INFINITY;

    if (!hasLower && !hasUpper) {
      ++nFreeRow;
      if (work->settings->nLogLevel>0) 
	cupdlp_printf("Warning: row %d is free.", iSeq - lp->nCols);
    }

    if (hasLower && hasUpper) {
      if (problem->lower[iSeq] == problem->upper[iSeq])
        ++nFixedRow;
      else
        ++nRangedRow;
    }

    if (hasLower) {
      // CUPDLP_ASSERT(x[iSeq] >= problem->lower[iSeq]);
      nLowerRow += !hasUpper;
    }

    if (hasUpper) {
      // CUPDLP_ASSERT(x[iSeq] <= problem->upper[iSeq]);
      nUpperRow += !hasLower;
    }
  }

  for (cupdlp_int iRow = 0; iRow < lp->nRows; ++iRow) {
    CUPDLP_ASSERT(y->data[iRow] < +INFINITY);
    CUPDLP_ASSERT(y->data[iRow] > -INFINITY);
  }

  for (cupdlp_int iRow = 0; iRow < lp->nRows; ++iRow) {
    if (problem->data->csr_matrix->rowMatBeg[iRow + 1] -
            problem->data->csr_matrix->rowMatBeg[iRow] ==
        1) {
      if (work->settings->nLogLevel>0) 
	cupdlp_printf("Warning: row %d is a singleton row.", iRow);
    }
  }

  CUPDLP_ASSERT(nRangedRow == 0);
  if (work->settings->nLogLevel>0) {
    cupdlp_printf("nFreeCol  : %d\n", nFreeCol);
    cupdlp_printf("nFixedCol : %d\n", nFixedCol);
    cupdlp_printf("nRangedCol: %d\n", nRangedCol);
    cupdlp_printf("nLowerCol : %d\n", nLowerCol);
    cupdlp_printf("nUpperCol : %d\n", nUpperCol);
    cupdlp_printf("nFreeRow  : %d\n", nFreeRow);
    cupdlp_printf("nFixedRow : %d\n", nFixedRow);
    cupdlp_printf("nRangedRow: %d\n", nRangedRow);
    cupdlp_printf("nLowerRow : %d\n", nLowerRow);
    cupdlp_printf("nUpperRow : %d\n", nUpperRow);
  }

  // We need to test problems ranged row-bounds more carefully.
  CUPDLP_ASSERT(nRangedRow == 0);
}